

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.h
# Opt level: O2

void __thiscall
chrono::geometry::ChTriangleMeshConnected::~ChTriangleMeshConnected(ChTriangleMeshConnected *this)

{
  ~ChTriangleMeshConnected(this);
  ::operator_delete(this,0x100);
  return;
}

Assistant:

~ChTriangleMeshConnected() {}